

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValidateDataStructure.cpp
# Opt level: O0

void __thiscall Assimp::ValidateDSProcess::Validate(ValidateDSProcess *this,aiMaterial *pMaterial)

{
  aiReturn aVar1;
  int local_30;
  float local_2c;
  int iShading;
  ai_real fTemp;
  aiMaterialProperty *prop;
  aiMaterial *paStack_18;
  uint i;
  aiMaterial *pMaterial_local;
  ValidateDSProcess *this_local;
  
  prop._4_4_ = 0;
  while( true ) {
    paStack_18 = pMaterial;
    pMaterial_local = (aiMaterial *)this;
    if (pMaterial->mNumProperties <= prop._4_4_) {
      aVar1 = aiGetMaterialInteger(pMaterial,"$mat.shadingm",0,0,&local_30);
      if ((aVar1 == aiReturn_SUCCESS) && ((local_30 - 3U < 2 || (local_30 == 8)))) {
        aVar1 = aiGetMaterialFloat(paStack_18,"$mat.shininess",0,0,&local_2c);
        if (aVar1 != aiReturn_SUCCESS) {
          ReportWarning(this,
                        "A specular shading model is specified but there is no AI_MATKEY_SHININESS key"
                       );
        }
        aVar1 = aiGetMaterialFloat(paStack_18,"$mat.shinpercent",0,0,&local_2c);
        if (((aVar1 == aiReturn_SUCCESS) && (local_2c == 0.0)) && (!NAN(local_2c))) {
          ReportWarning(this,
                        "A specular shading model is specified but the value of the AI_MATKEY_SHININESS_STRENGTH key is 0.0"
                       );
        }
      }
      aVar1 = aiGetMaterialFloat(paStack_18,"$mat.opacity",0,0,&local_2c);
      if ((aVar1 == aiReturn_SUCCESS) &&
         (((local_2c == 0.0 && (!NAN(local_2c))) || (1.01 < local_2c)))) {
        ReportWarning(this,"Invalid opacity value (must be 0 < opacity < 1.0)");
      }
      SearchForInvalidTextures(this,paStack_18,aiTextureType_DIFFUSE);
      SearchForInvalidTextures(this,paStack_18,aiTextureType_SPECULAR);
      SearchForInvalidTextures(this,paStack_18,aiTextureType_AMBIENT);
      SearchForInvalidTextures(this,paStack_18,aiTextureType_EMISSIVE);
      SearchForInvalidTextures(this,paStack_18,aiTextureType_OPACITY);
      SearchForInvalidTextures(this,paStack_18,aiTextureType_SHININESS);
      SearchForInvalidTextures(this,paStack_18,aiTextureType_HEIGHT);
      SearchForInvalidTextures(this,paStack_18,aiTextureType_NORMALS);
      SearchForInvalidTextures(this,paStack_18,aiTextureType_DISPLACEMENT);
      SearchForInvalidTextures(this,paStack_18,aiTextureType_LIGHTMAP);
      SearchForInvalidTextures(this,paStack_18,aiTextureType_REFLECTION);
      return;
    }
    _iShading = pMaterial->mProperties[prop._4_4_];
    if (_iShading == (aiMaterialProperty *)0x0) break;
    if ((_iShading->mDataLength == 0) || (_iShading->mData == (char *)0x0)) {
      ReportError(this,
                  "aiMaterial::mProperties[%i].mDataLength or aiMaterial::mProperties[%i].mData is 0"
                  ,(ulong)prop._4_4_,(ulong)prop._4_4_);
    }
    if (_iShading->mType == aiPTI_String) {
      if ((_iShading->mDataLength < 5) || (_iShading->mDataLength < *(int *)_iShading->mData + 5U))
      {
        ReportError(this,
                    "aiMaterial::mProperties[%i].mDataLength is too small to contain a string (%i, needed: %i)"
                    ,(ulong)prop._4_4_,(ulong)_iShading->mDataLength,0x404);
      }
      if (_iShading->mData[_iShading->mDataLength - 1] != '\0') {
        ReportError(this,"Missing null-terminator in string material property");
      }
    }
    else if (_iShading->mType == aiPTI_Float) {
      if (_iShading->mDataLength < 4) {
        ReportError(this,
                    "aiMaterial::mProperties[%i].mDataLength is too small to contain a float (%i, needed: %i)"
                    ,(ulong)prop._4_4_,(ulong)_iShading->mDataLength,4);
      }
    }
    else if ((_iShading->mType == aiPTI_Integer) && (_iShading->mDataLength < 4)) {
      ReportError(this,
                  "aiMaterial::mProperties[%i].mDataLength is too small to contain an integer (%i, needed: %i)"
                  ,(ulong)prop._4_4_,(ulong)_iShading->mDataLength,4);
    }
    prop._4_4_ = prop._4_4_ + 1;
  }
  ReportError(this,"aiMaterial::mProperties[%i] is NULL (aiMaterial::mNumProperties is %i)",
              (ulong)prop._4_4_,(ulong)pMaterial->mNumProperties);
}

Assistant:

void ValidateDSProcess::Validate( const aiMaterial* pMaterial)
{
    // check whether there are material keys that are obviously not legal
    for (unsigned int i = 0; i < pMaterial->mNumProperties;++i)
    {
        const aiMaterialProperty* prop = pMaterial->mProperties[i];
        if (!prop)  {
            ReportError("aiMaterial::mProperties[%i] is NULL (aiMaterial::mNumProperties is %i)",
                i,pMaterial->mNumProperties);
        }
        if (!prop->mDataLength || !prop->mData) {
            ReportError("aiMaterial::mProperties[%i].mDataLength or "
                "aiMaterial::mProperties[%i].mData is 0",i,i);
        }
        // check all predefined types
        if (aiPTI_String == prop->mType)    {
            // FIX: strings are now stored in a less expensive way, but we can't use the
            // validation routine for 'normal' aiStrings
            if (prop->mDataLength < 5 || prop->mDataLength < 4 + (*reinterpret_cast<uint32_t*>(prop->mData)) + 1)   {
                ReportError("aiMaterial::mProperties[%i].mDataLength is "
                    "too small to contain a string (%i, needed: %i)",
                    i,prop->mDataLength,static_cast<int>(sizeof(aiString)));
            }
            if(prop->mData[prop->mDataLength-1]) {
                ReportError("Missing null-terminator in string material property");
            }
        //  Validate((const aiString*)prop->mData);
        }
        else if (aiPTI_Float == prop->mType)    {
            if (prop->mDataLength < sizeof(float))  {
                ReportError("aiMaterial::mProperties[%i].mDataLength is "
                    "too small to contain a float (%i, needed: %i)",
                    i,prop->mDataLength, static_cast<int>(sizeof(float)));
            }
        }
        else if (aiPTI_Integer == prop->mType)  {
            if (prop->mDataLength < sizeof(int))    {
                ReportError("aiMaterial::mProperties[%i].mDataLength is "
                    "too small to contain an integer (%i, needed: %i)",
                    i,prop->mDataLength, static_cast<int>(sizeof(int)));
            }
        }
        // TODO: check whether there is a key with an unknown name ...
    }

    // make some more specific tests
    ai_real fTemp;
    int iShading;
    if (AI_SUCCESS == aiGetMaterialInteger( pMaterial,AI_MATKEY_SHADING_MODEL,&iShading))   {
        switch ((aiShadingMode)iShading)
        {
        case aiShadingMode_Blinn:
        case aiShadingMode_CookTorrance:
        case aiShadingMode_Phong:

            if (AI_SUCCESS != aiGetMaterialFloat(pMaterial,AI_MATKEY_SHININESS,&fTemp)) {
                ReportWarning("A specular shading model is specified but there is no "
                    "AI_MATKEY_SHININESS key");
            }
            if (AI_SUCCESS == aiGetMaterialFloat(pMaterial,AI_MATKEY_SHININESS_STRENGTH,&fTemp) && !fTemp)  {
                ReportWarning("A specular shading model is specified but the value of the "
                    "AI_MATKEY_SHININESS_STRENGTH key is 0.0");
            }
            break;
        default:
            break;
        }
    }

    if (AI_SUCCESS == aiGetMaterialFloat( pMaterial,AI_MATKEY_OPACITY,&fTemp) && (!fTemp || fTemp > 1.01)) {
        ReportWarning("Invalid opacity value (must be 0 < opacity < 1.0)");
    }

    // Check whether there are invalid texture keys
    // TODO: that's a relict of the past, where texture type and index were baked
    // into the material string ... we could do that in one single pass.
    SearchForInvalidTextures(pMaterial,aiTextureType_DIFFUSE);
    SearchForInvalidTextures(pMaterial,aiTextureType_SPECULAR);
    SearchForInvalidTextures(pMaterial,aiTextureType_AMBIENT);
    SearchForInvalidTextures(pMaterial,aiTextureType_EMISSIVE);
    SearchForInvalidTextures(pMaterial,aiTextureType_OPACITY);
    SearchForInvalidTextures(pMaterial,aiTextureType_SHININESS);
    SearchForInvalidTextures(pMaterial,aiTextureType_HEIGHT);
    SearchForInvalidTextures(pMaterial,aiTextureType_NORMALS);
    SearchForInvalidTextures(pMaterial,aiTextureType_DISPLACEMENT);
    SearchForInvalidTextures(pMaterial,aiTextureType_LIGHTMAP);
    SearchForInvalidTextures(pMaterial,aiTextureType_REFLECTION);
}